

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

string * __thiscall cmTarget::GetSafeProperty(cmTarget *this,string *prop)

{
  cmValue cVar1;
  string *local_10;
  
  cVar1 = GetProperty(this,prop);
  if (cVar1.Value == (string *)0x0) {
    if (GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_ == '\0') {
      GetSafeProperty();
      cVar1.Value = local_10;
    }
    else {
      cVar1.Value = &GetSafeProperty(std::__cxx11::string_const&)::s_empty_abi_cxx11_;
    }
  }
  return cVar1.Value;
}

Assistant:

std::string const& cmTarget::GetSafeProperty(std::string const& prop) const
{
  cmValue ret = this->GetProperty(prop);
  if (ret) {
    return *ret;
  }

  static std::string const s_empty;
  return s_empty;
}